

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderEms.cpp
# Opt level: O2

FilereaderRetcode __thiscall
FilereaderEms::readModelFromFile
          (FilereaderEms *this,HighsOptions *options,string *filename,HighsModel *model)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *this_02;
  int *piVar3;
  HighsModel *pHVar4;
  char cVar5;
  bool bVar6;
  HighsInt HVar7;
  string *psVar8;
  ulong uVar9;
  FilereaderRetcode FVar10;
  char *format;
  long lVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_03;
  int iVar12;
  long lVar13;
  HighsInt numCol;
  HighsInt numRow;
  string line;
  HighsInt AcountX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_268;
  HighsInt iCol;
  undefined4 uStack_25c;
  HighsInt num_int;
  HighsSparseMatrix *local_250;
  HighsOptions *local_248;
  HighsModel *local_240;
  ifstream f;
  
  local_248 = options;
  std::ifstream::ifstream((string *)&f);
  std::ifstream::open((string *)&f,(_Ios_Openmode)filename);
  cVar5 = std::__basic_file<char>::is_open();
  if (cVar5 == '\0') {
    highsLogUser(&(local_248->super_HighsOptionsStruct).log_options,kError,"EMS file not found\n");
    FVar10 = kFileNotFound;
    goto LAB_0021c61a;
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
  psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
  bVar6 = std::operator!=(psVar8,"n_rows");
  local_268 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT71(local_268._1_7_,bVar6);
  if (bVar6) {
    while( true ) {
      psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
      bVar6 = std::operator!=(psVar8,"n_rows");
      if ((!bVar6) ||
         (((&f.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
           [(long)f.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] & 5)
          != 0)) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    }
  }
  if (((&f.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
       [(long)f.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] & 5) ==
      0) {
    std::istream::operator>>(&f,&numRow);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    while( true ) {
      psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
      bVar6 = std::operator==(psVar8,"");
      if (!bVar6) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    }
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator!=(psVar8,"n_columns");
    if (bVar6) {
      format = "n_columns not found in EMS file\n";
      goto LAB_0021c5f4;
    }
    std::istream::operator>>(&f,&numCol);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    while( true ) {
      psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
      bVar6 = std::operator==(psVar8,"");
      if (!bVar6) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    }
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator!=(psVar8,"n_matrix_elements");
    if (bVar6) {
      format = "n_matrix_elements not found in EMS file\n";
      goto LAB_0021c5f4;
    }
    std::istream::operator>>(&f,&AcountX);
    (model->lp_).num_col_ = numCol;
    (model->lp_).num_row_ = numRow;
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    while( true ) {
      psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
      bVar6 = std::operator==(psVar8,"");
      if (!bVar6) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    }
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator!=(psVar8,"matrix");
    if (bVar6) {
      format = "matrix not found in EMS file\n";
      goto LAB_0021c5f4;
    }
    (model->lp_).a_matrix_.format_ = kColwise;
    this_00 = &(model->lp_).a_matrix_.start_;
    std::vector<int,_std::allocator<int>_>::resize(this_00,(long)numCol + 1);
    this_01 = &(model->lp_).a_matrix_.index_;
    std::vector<int,_std::allocator<int>_>::resize(this_01,(long)AcountX);
    std::vector<double,_std::allocator<double>_>::resize
              (&(model->lp_).a_matrix_.value_,(long)AcountX);
    local_250 = &(model->lp_).a_matrix_;
    lVar11 = 0;
    local_240 = model;
    for (lVar13 = 0; lVar13 <= numCol; lVar13 = lVar13 + 1) {
      std::istream::operator>>
                (&f,(int *)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar11));
      if ((char)local_268 != '\0') {
        piVar3 = (int *)((long)(this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar11);
        *piVar3 = *piVar3 + -1;
      }
      lVar11 = lVar11 + 4;
    }
    lVar13 = 0;
    for (lVar11 = 0; pHVar4 = local_240, uVar9 = (ulong)AcountX, lVar11 < (long)uVar9;
        lVar11 = lVar11 + 1) {
      std::istream::operator>>
                (&f,(int *)((long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start + lVar13));
      if ((char)local_268 != '\0') {
        piVar3 = (int *)((long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar13);
        *piVar3 = *piVar3 + -1;
      }
      lVar13 = lVar13 + 4;
    }
    for (lVar11 = 0; lVar11 < (int)uVar9; lVar11 = lVar11 + 1) {
      std::istream::_M_extract<double>((double *)&f);
      uVar9 = (ulong)(uint)AcountX;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    while( true ) {
      psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
      bVar6 = std::operator==(psVar8,"");
      if (!bVar6) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    }
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator!=(psVar8,"column_bounds");
    if (bVar6) {
      format = "column_bounds not found in EMS file\n";
      goto LAB_0021c5f4;
    }
    pvVar1 = &(pHVar4->lp_).col_lower_;
    std::vector<double,_std::allocator<double>_>::reserve(pvVar1,(long)numCol);
    pvVar2 = &(pHVar4->lp_).col_upper_;
    std::vector<double,_std::allocator<double>_>::reserve(pvVar2,(long)numCol);
    _iCol = -INFINITY;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (pvVar1,(long)numCol,(value_type_conflict1 *)&iCol);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (pvVar2,(long)numCol,(value_type_conflict1 *)&kHighsInf);
    for (lVar11 = 0; uVar9 = (ulong)numCol, lVar11 < (long)uVar9; lVar11 = lVar11 + 1) {
      std::istream::_M_extract<double>((double *)&f);
    }
    for (lVar11 = 0; lVar11 < (int)uVar9; lVar11 = lVar11 + 1) {
      std::istream::_M_extract<double>((double *)&f);
      uVar9 = (ulong)(uint)numCol;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    while( true ) {
      psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
      bVar6 = std::operator==(psVar8,"");
      if (!bVar6) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    }
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator!=(psVar8,"row_bounds");
    if (bVar6) {
      format = "row_bounds not found in EMS file\n";
      goto LAB_0021c5f4;
    }
    pvVar1 = &(pHVar4->lp_).row_lower_;
    std::vector<double,_std::allocator<double>_>::reserve(pvVar1,(long)numRow);
    pvVar2 = &(pHVar4->lp_).row_upper_;
    std::vector<double,_std::allocator<double>_>::reserve(pvVar2,(long)numRow);
    _iCol = -INFINITY;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (pvVar1,(long)numRow,(value_type_conflict1 *)&iCol);
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (pvVar2,(long)numRow,(value_type_conflict1 *)&kHighsInf);
    for (lVar11 = 0; uVar9 = (ulong)numRow, lVar11 < (long)uVar9; lVar11 = lVar11 + 1) {
      std::istream::_M_extract<double>((double *)&f);
    }
    for (lVar11 = 0; lVar11 < (int)uVar9; lVar11 = lVar11 + 1) {
      std::istream::_M_extract<double>((double *)&f);
      uVar9 = (ulong)(uint)numRow;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    while( true ) {
      psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
      bVar6 = std::operator==(psVar8,"");
      if (!bVar6) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    }
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator!=(psVar8,"column_costs");
    if (bVar6) {
      format = "column_costs not found in EMS file\n";
      goto LAB_0021c5f4;
    }
    pvVar1 = &(pHVar4->lp_).col_cost_;
    std::vector<double,_std::allocator<double>_>::reserve(pvVar1,(long)numCol);
    _iCol = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign
              (pvVar1,(long)numCol,(value_type_conflict1 *)&iCol);
    for (lVar11 = 0; lVar11 < numCol; lVar11 = lVar11 + 1) {
      std::istream::_M_extract<double>((double *)&f);
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    while( true ) {
      psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
      bVar6 = std::operator==(psVar8,"");
      if ((!bVar6) ||
         (((&f.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
           [(long)f.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] & 5)
          != 0)) break;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    }
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator==(psVar8,"integer_columns");
    if (bVar6) {
      std::istream::operator>>(&f,&num_int);
      if (num_int != 0) {
        this_02 = &(pHVar4->lp_).integrality_;
        _iCol = (value_type_conflict1)((ulong)_iCol & 0xffffffffffffff00);
        std::vector<HighsVarType,_std::allocator<HighsVarType>_>::resize
                  (this_02,(long)(pHVar4->lp_).num_col_,(value_type *)&iCol);
        for (iVar12 = 0; iVar12 < num_int; iVar12 = iVar12 + 1) {
          std::istream::operator>>(&f,&iCol);
          HVar7 = iCol;
          if ((char)local_268 != '\0') {
            HVar7 = iCol + -1;
            _iCol = (value_type_conflict1)CONCAT44(uStack_25c,HVar7);
          }
          (this_02->super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>)._M_impl.
          super__Vector_impl_data._M_start[HVar7] = kInteger;
        }
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
      while( true ) {
        psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
        bVar6 = std::operator==(psVar8,"");
        if ((!bVar6) ||
           (((&f.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
             [(long)f.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] &
            5) != 0)) break;
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
      }
    }
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator==(psVar8,"end_linear");
    if (bVar6) {
      std::ifstream::close();
      HighsSparseMatrix::ensureColwise(local_250);
    }
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator==(psVar8,"names");
    if (!bVar6) {
      format = "names not found in EMS file\n";
      if (((&f.super_basic_istream<char,_std::char_traits<char>_>.field_0x20)
           [(long)f.super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]] & 5)
          != 0) {
        HighsSparseMatrix::ensureColwise(local_250);
      }
      goto LAB_0021c5f4;
    }
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator!=(psVar8,"columns");
    if (bVar6) {
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
    }
    psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
    bVar6 = std::operator!=(psVar8,"columns");
    if (!bVar6) {
      local_268 = &(pHVar4->lp_).row_names_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(local_268,(long)numRow);
      this_03 = &(pHVar4->lp_).col_names_;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(this_03,(long)numCol);
      lVar11 = 0;
      for (lVar13 = 0; lVar13 < numCol; lVar13 = lVar13 + 1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
        trim(&line,&default_non_chars_abi_cxx11_);
        std::__cxx11::string::_M_assign
                  ((string *)
                   ((long)&(((this_03->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar11
                   ));
        lVar11 = lVar11 + 0x20;
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
      psVar8 = trim(&line,&default_non_chars_abi_cxx11_);
      bVar6 = std::operator!=(psVar8,"rows");
      if (!bVar6) {
        lVar13 = 0;
        for (lVar11 = 0; lVar11 < numRow; lVar11 = lVar11 + 1) {
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    (&f.super_basic_istream<char,_std::char_traits<char>_>,(string *)&line);
          trim(&line,&default_non_chars_abi_cxx11_);
          std::__cxx11::string::_M_assign
                    ((string *)
                     ((long)&(((local_268->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                     lVar13));
          lVar13 = lVar13 + 0x20;
        }
        std::ifstream::close();
        std::__cxx11::string::~string((string *)&line);
        FVar10 = kOk;
        HighsSparseMatrix::ensureColwise(local_250);
        goto LAB_0021c61a;
      }
    }
  }
  else {
    format = "n_rows not found in EMS file\n";
LAB_0021c5f4:
    highsLogUser(&(local_248->super_HighsOptionsStruct).log_options,kError,format);
  }
  std::__cxx11::string::~string((string *)&line);
  FVar10 = kParserError;
LAB_0021c61a:
  std::ifstream::~ifstream(&f);
  return FVar10;
}

Assistant:

FilereaderRetcode FilereaderEms::readModelFromFile(const HighsOptions& options,
                                                   const std::string filename,
                                                   HighsModel& model) {
  std::ifstream f;
  HighsInt i;

  HighsLp& lp = model.lp_;
  f.open(filename, std::ios::in);
  if (f.is_open()) {
    std::string line;
    HighsInt numCol, numRow, AcountX, num_int;
    bool indices_from_one = false;

    // counts
    std::getline(f, line);
    if (trim(line) != "n_rows") {
      while (trim(line) != "n_rows" && f) std::getline(f, line);
      indices_from_one = true;
    }
    if (!f) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "n_rows not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f >> numRow;

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "n_columns") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "n_columns not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f >> numCol;

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "n_matrix_elements") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "n_matrix_elements not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f >> AcountX;

    lp.num_col_ = numCol;
    lp.num_row_ = numRow;

    // matrix
    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "matrix") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "matrix not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.a_matrix_.format_ = MatrixFormat::kColwise;
    lp.a_matrix_.start_.resize(numCol + 1);
    lp.a_matrix_.index_.resize(AcountX);
    lp.a_matrix_.value_.resize(AcountX);

    for (i = 0; i < numCol + 1; i++) {
      f >> lp.a_matrix_.start_[i];
      if (indices_from_one) lp.a_matrix_.start_[i]--;
    }

    for (i = 0; i < AcountX; i++) {
      f >> lp.a_matrix_.index_[i];
      if (indices_from_one) lp.a_matrix_.index_[i]--;
    }

    for (i = 0; i < AcountX; i++) f >> lp.a_matrix_.value_[i];

    // cost and bounds
    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "column_bounds") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "column_bounds not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.col_lower_.reserve(numCol);
    lp.col_upper_.reserve(numCol);

    lp.col_lower_.assign(numCol, -kHighsInf);
    lp.col_upper_.assign(numCol, kHighsInf);

    for (i = 0; i < numCol; i++) {
      f >> lp.col_lower_[i];
    }

    for (i = 0; i < numCol; i++) {
      f >> lp.col_upper_[i];
    }

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "row_bounds") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "row_bounds not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.row_lower_.reserve(numRow);
    lp.row_upper_.reserve(numRow);
    lp.row_lower_.assign(numRow, -kHighsInf);
    lp.row_upper_.assign(numRow, kHighsInf);

    for (i = 0; i < numRow; i++) {
      f >> lp.row_lower_[i];
    }

    for (i = 0; i < numRow; i++) {
      f >> lp.row_upper_[i];
    }

    std::getline(f, line);
    while (trim(line) == "") std::getline(f, line);
    if (trim(line) != "column_costs") {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "column_costs not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    lp.col_cost_.reserve(numCol);
    lp.col_cost_.assign(numCol, 0);
    for (i = 0; i < numCol; i++) {
      f >> lp.col_cost_[i];
    }

    // Get the next keyword
    std::getline(f, line);
    while (trim(line) == "" && f) std::getline(f, line);

    if (trim(line) == "integer_columns") {
      f >> num_int;
      if (num_int) {
        lp.integrality_.resize(lp.num_col_, HighsVarType::kContinuous);
        HighsInt iCol;
        for (i = 0; i < num_int; i++) {
          f >> iCol;
          if (indices_from_one) iCol--;
          lp.integrality_[iCol] = HighsVarType::kInteger;
        }
      }
      // Get the next keyword. If there's no integer_columns section
      // then it will already have been read
      std::getline(f, line);
      while (trim(line) == "" && f) std::getline(f, line);
    }

    // Act if the next keyword is end_linear
    if (trim(line) == "end_linear") {
      // File read completed OK
      f.close();
      lp.ensureColwise();
    }

    // Act if the next keyword is names
    if (trim(line) == "names") {
      // Ignore length since we support any length.
      std::getline(f, line);
      if (trim(line) != "columns") std::getline(f, line);
      if (trim(line) != "columns") return FilereaderRetcode::kParserError;

      lp.row_names_.resize(numRow);
      lp.col_names_.resize(numCol);

      for (i = 0; i < numCol; i++) {
        std::getline(f, line);
        lp.col_names_[i] = trim(line);
      }

      std::getline(f, line);
      if (trim(line) != "rows") return FilereaderRetcode::kParserError;

      for (i = 0; i < numRow; i++) {
        std::getline(f, line);
        lp.row_names_[i] = trim(line);
      }
    } else {
      // OK if file just ends after the integer_columns section without
      // end_linear
      if (!f) lp.ensureColwise();
      highsLogUser(options.log_options, HighsLogType::kError,
                   "names not found in EMS file\n");
      return FilereaderRetcode::kParserError;
    }
    f.close();
  } else {
    highsLogUser(options.log_options, HighsLogType::kError,
                 "EMS file not found\n");
    return FilereaderRetcode::kFileNotFound;
  }
  lp.ensureColwise();
  return FilereaderRetcode::kOk;
}